

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O2

int lmder(custom_funcmult *funcmult,custom_jacobian *jacobian,double *x,int M,int N,double *fvec,
         double *fjac,int ldfjac,int maxfev,double *diag,int mode,double factor,int nprint,
         double eps,double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt,double *qtf)

{
  size_t __size;
  bool bVar1;
  bool bVar2;
  int iVar3;
  double dVar4;
  double *rdiag;
  double *x_00;
  double *pdVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  int iVar12;
  double *pdVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  double *pdVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double *in_stack_fffffffffffffe68;
  double local_a8;
  double local_98;
  double local_80;
  double par;
  int local_6c;
  double local_68;
  double *local_60;
  double local_58;
  double *local_50;
  double *local_48;
  double *local_40;
  uint local_34;
  
  pdVar17 = (double *)(ulong)(uint)N;
  local_40 = (double *)(long)N;
  __size = (long)local_40 * 8;
  local_60 = fvec;
  local_48 = x;
  rdiag = (double *)malloc(__size);
  par = (double)malloc(__size);
  x_00 = (double *)malloc(__size);
  pdVar5 = (double *)malloc((long)M << 3);
  pdVar7 = local_60;
  *nfev = 0;
  *njev = 0;
  uVar15 = 0;
  uVar16 = 0;
  if (((((0 < (int)local_40) && (N <= M)) && (uVar16 = uVar15, M <= ldfjac)) &&
      ((0.0 <= ftol && (0.0 <= xtol)))) && ((0.0 < factor && ((0 < maxfev && (0.0 <= gtol)))))) {
    if (mode == 2) {
      pdVar11 = (double *)0x0;
      do {
        if (pdVar17 == pdVar11) goto LAB_00140892;
        pdVar13 = diag + (long)pdVar11;
        pdVar11 = (double *)((long)pdVar11 + 1);
      } while (0.0 < *pdVar13);
      uVar16 = 0;
    }
    else {
LAB_00140892:
      local_50 = pdVar17;
      local_40 = pdVar5;
      local_34 = M;
      (*funcmult->funcmult)(local_48,M,N,local_60,funcmult->params);
      *nfev = 1;
      local_a8 = enorm(pdVar7,M);
      local_80 = 0.0;
      iVar3 = (int)local_50;
      uVar6 = (ulong)(uint)M;
      local_6c = 1;
      pdVar7 = local_48;
      while( true ) {
        pdVar5 = fjac;
        (*jacobian->jacobian)(pdVar7,M,(int)local_50,fjac,jacobian->params);
        *njev = *njev + 1;
        qrfac(fjac,local_34,(int)local_50,(int)pdVar5,1,ipvt,(int)in_stack_fffffffffffffe68,rdiag,
              (double *)par,eps);
        dVar18 = local_68;
        if (local_6c == 1) {
          if (mode != 2) {
            for (pdVar7 = (double *)0x0; pdVar17 != pdVar7; pdVar7 = (double *)((long)pdVar7 + 1)) {
              dVar18 = *(double *)((long)par + (long)pdVar7 * 8);
              uVar8 = -(ulong)(dVar18 == 0.0);
              diag[(long)pdVar7] = (double)(uVar8 & 0x3ff0000000000000 | ~uVar8 & (ulong)dVar18);
            }
          }
          for (pdVar7 = (double *)0x0; pdVar17 != pdVar7; pdVar7 = (double *)((long)pdVar7 + 1)) {
            x_00[(long)pdVar7] = diag[(long)pdVar7] * local_48[(long)pdVar7];
          }
          dVar18 = enorm(x_00,(int)local_50);
          local_58 = dVar18 * factor;
          if ((local_58 == 0.0) && (!NAN(local_58))) {
            local_58 = factor;
          }
        }
        for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          local_40[uVar8] = local_60[uVar8];
        }
        lVar10 = 0;
        pdVar11 = (double *)0x0;
        pdVar7 = fjac;
        pdVar5 = local_40;
        while( true ) {
          uVar8 = (ulong)pdVar11 & 0xffffffff;
          if ((int)pdVar11 < (int)local_34) {
            uVar8 = (ulong)local_34;
          }
          if (pdVar11 == pdVar17) break;
          iVar12 = (iVar3 + 1) * (int)pdVar11;
          dVar19 = fjac[iVar12];
          if ((dVar19 != 0.0) || (NAN(dVar19))) {
            dVar24 = 0.0;
            pdVar13 = pdVar7;
            for (lVar14 = 0; uVar8 + lVar10 != lVar14; lVar14 = lVar14 + 1) {
              dVar24 = dVar24 + *pdVar13 * pdVar5[lVar14];
              pdVar13 = pdVar13 + (long)pdVar17;
            }
            local_98 = -dVar24 / dVar19;
            pdVar13 = pdVar7;
            for (lVar14 = 0; uVar8 + lVar10 != lVar14; lVar14 = lVar14 + 1) {
              pdVar5[lVar14] = *pdVar13 * local_98 + pdVar5[lVar14];
              pdVar13 = pdVar13 + (long)pdVar17;
            }
          }
          fjac[iVar12] = rdiag[(long)pdVar11];
          qtf[(long)pdVar11] = local_40[(long)pdVar11];
          pdVar11 = (double *)((long)pdVar11 + 1);
          lVar10 = lVar10 + -1;
          pdVar5 = pdVar5 + 1;
          pdVar7 = pdVar7 + (long)pdVar17 + 1;
        }
        dVar19 = 0.0;
        pdVar7 = local_48;
        local_68 = dVar18;
        if ((local_a8 != 0.0) || (NAN(local_a8))) {
          dVar19 = 0.0;
          lVar10 = 1;
          pdVar11 = fjac;
          for (pdVar5 = (double *)0x0; pdVar5 != pdVar17; pdVar5 = (double *)((long)pdVar5 + 1)) {
            dVar24 = *(double *)((long)par + (long)ipvt[(long)pdVar5] * 8);
            if ((dVar24 != 0.0) || (NAN(dVar24))) {
              dVar18 = 0.0;
              pdVar7 = pdVar11;
              for (lVar14 = 0; lVar10 != lVar14; lVar14 = lVar14 + 1) {
                dVar18 = dVar18 + (qtf[lVar14] / local_a8) * *pdVar7;
                pdVar7 = pdVar7 + (long)pdVar17;
              }
              dVar19 = pmax(dVar19,ABS(dVar18 / dVar24));
              pdVar7 = local_48;
              dVar18 = local_68;
            }
            lVar10 = lVar10 + 1;
            pdVar11 = pdVar11 + 1;
          }
        }
        if (dVar19 <= gtol) break;
        dVar24 = local_58;
        if (mode != 2) {
          for (pdVar5 = (double *)0x0; dVar24 = local_58, pdVar17 != pdVar5;
              pdVar5 = (double *)((long)pdVar5 + 1)) {
            dVar18 = pmax(diag[(long)pdVar5],*(double *)((long)par + (long)pdVar5 * 8));
            diag[(long)pdVar5] = dVar18;
            pdVar7 = local_48;
            dVar18 = local_68;
          }
        }
        dVar25 = 0.0;
        while (dVar22 = par, M = local_34, local_68 = dVar18, local_58 = dVar24, dVar25 < 0.0001) {
          in_stack_fffffffffffffe68 = &local_80;
          lmpar(fjac,(int)pdVar11,(int)local_50,ipvt,diag,qtf,dVar24,in_stack_fffffffffffffe68,rdiag
                ,(double *)par);
          for (pdVar7 = (double *)0x0; pdVar17 != pdVar7; pdVar7 = (double *)((long)pdVar7 + 1)) {
            dVar18 = rdiag[(long)pdVar7];
            dVar24 = -dVar18;
            rdiag[(long)pdVar7] = dVar24;
            *(double *)((long)dVar22 + (long)pdVar7 * 8) = local_48[(long)pdVar7] - dVar18;
            x_00[(long)pdVar7] = diag[(long)pdVar7] * dVar24;
          }
          dVar18 = enorm(x_00,(int)local_50);
          if (local_6c == 1) {
            local_58 = pmin(local_58,dVar18);
          }
          (*funcmult->funcmult)((double *)dVar22,local_34,(int)local_50,local_40,funcmult->params);
          *nfev = *nfev + 1;
          dVar20 = enorm(local_40,local_34);
          dVar23 = 1.0 - (dVar20 / local_a8) * (dVar20 / local_a8);
          lVar10 = 1;
          pdVar7 = fjac;
          for (pdVar5 = (double *)0x0; pdVar5 != pdVar17; pdVar5 = (double *)((long)pdVar5 + 1)) {
            x_00[(long)pdVar5] = 0.0;
            local_98 = rdiag[ipvt[(long)pdVar5]];
            pdVar11 = pdVar7;
            for (lVar14 = 0; lVar10 != lVar14; lVar14 = lVar14 + 1) {
              x_00[lVar14] = *pdVar11 * local_98 + x_00[lVar14];
              pdVar11 = pdVar11 + (long)pdVar17;
            }
            lVar10 = lVar10 + 1;
            pdVar7 = pdVar7 + 1;
          }
          dVar24 = enorm(x_00,(int)local_50);
          dVar4 = local_80;
          if (local_80 < 0.0) {
            dVar25 = sqrt(local_80);
          }
          else {
            dVar25 = SQRT(local_80);
          }
          uVar8 = -(ulong)(dVar20 * 0.1 < local_a8);
          dVar26 = (double)(~uVar8 & 0xbff0000000000000 | uVar8 & (ulong)dVar23);
          dVar21 = (dVar25 * dVar18) / local_a8;
          dVar21 = dVar21 * dVar21;
          dVar24 = (dVar24 / local_a8) * (dVar24 / local_a8);
          dVar27 = dVar21 + dVar21 + dVar24;
          dVar25 = (double)(-(ulong)(dVar27 != 0.0) & (ulong)(dVar26 / dVar27));
          if (dVar25 <= 0.25) {
            dVar24 = dVar24 + dVar21;
            dVar24 = (double)(~-(ulong)(dVar26 < 0.0) &
                              (~-(ulong)(dVar26 < 0.0) & 0x3fe0000000000000 |
                              (ulong)local_98 & -(ulong)(dVar26 < 0.0)) |
                             (ulong)((dVar24 * -0.5) / (dVar26 * 0.5 - dVar24)) &
                             -(ulong)(dVar26 < 0.0));
            local_98 = 0.1;
            if (dVar20 * 0.1 < local_a8 && 0.1 <= dVar24) {
              local_98 = dVar24;
            }
            dVar18 = pmin(local_58,dVar18 / 0.1);
            local_80 = dVar4 / local_98;
            dVar24 = dVar18 * local_98;
          }
          else if (((dVar4 == 0.0) && (!NAN(dVar4))) || (dVar24 = local_58, 0.75 <= dVar25)) {
            local_80 = dVar4 * 0.5;
            dVar24 = dVar18 + dVar18;
          }
          pdVar11 = diag;
          dVar18 = local_68;
          if (0.0001 <= dVar25) {
            for (pdVar7 = (double *)0x0; pdVar17 != pdVar7; pdVar7 = (double *)((long)pdVar7 + 1)) {
              dVar18 = *(double *)((long)dVar22 + (long)pdVar7 * 8);
              local_48[(long)pdVar7] = dVar18;
              *(double *)((long)dVar22 + (long)pdVar7 * 8) = dVar18 * diag[(long)pdVar7];
            }
            for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
              local_60[uVar9] = local_40[uVar9];
            }
            pdVar11 = local_50;
            local_58 = dVar24;
            dVar18 = enorm((double *)dVar22,(int)local_50);
            local_6c = local_6c + 1;
            dVar24 = local_58;
            local_a8 = dVar20;
          }
          dVar23 = (double)(~uVar8 & 0x3ff0000000000000 | (ulong)ABS(dVar23) & uVar8);
          bVar1 = ftol < dVar23;
          bVar2 = ftol < dVar27;
          dVar22 = dVar25 * 0.5;
          dVar20 = dVar18 * xtol;
          if (((!bVar2 && !bVar1) && (dVar22 <= 1.0)) && (dVar24 <= dVar20)) {
            uVar16 = 3;
            goto LAB_00141251;
          }
          if (((!bVar2 && !bVar1) && 1.0 >= dVar22) || (dVar24 <= dVar20)) {
            uVar16 = 2;
            if (dVar20 < dVar24) {
              uVar16 = (byte)~((bVar2 || bVar1) || 1.0 < dVar22) & 1;
            }
            goto LAB_00141251;
          }
          uVar15 = (uint)(maxfev <= *nfev) * 5;
          uVar16 = 6;
          if (1.0 < dVar22) {
            uVar16 = uVar15;
          }
          if (eps < dVar27) {
            uVar16 = uVar15;
          }
          if (eps < dVar23) {
            uVar16 = uVar15;
          }
          if (dVar24 <= dVar18 * eps) {
            uVar16 = 7;
          }
          if (dVar19 <= eps) {
            uVar16 = 8;
          }
          pdVar7 = local_48;
          if (uVar16 != 0) goto LAB_00141251;
        }
      }
      uVar16 = 4;
LAB_00141251:
      free(rdiag);
      free((void *)par);
      free(x_00);
      free(local_40);
    }
  }
  return uVar16;
}

Assistant:

int lmder(custom_funcmult *funcmult, custom_jacobian *jacobian, double *x, int M, int N,
		double *fvec,double *fjac,int ldfjac,int maxfev,double *diag,int mode,double factor,int nprint,
		double eps,double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt, double *qtf) {
	int info;
	int i,j,l,iter;
    double actred,delta,dirder,epsmch,fnorm,fnorm1,gnorm,one,par,pnorm,prered,p1,p5,p25,p75,p0001,ratio,
    sum,temp,temp1,temp2,xnorm,zero;
    double *wa1,*wa2,*wa3,*wa4;

    /*
     * 	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more
     *  M is a positive integer input variable set to the number
c         of functions.
c
c       N is a positive integer input variable set to the number
c         of variables. N must not exceed M.
c
c       x is an array of length N. on input x must contain
c         an initial estimate of the solution vector. on output x
c         contains the final estimate of the solution vector.
c
c       fvec is an output array of length M which contains
c         the functions evaluated at the output x.
c
c       fjac is an output M by N array. the upper N by N submatrix
c         of fjac contains an upper triangular matrix r with
c         diagonal elements of nonincreasing magnitude such that
c
c                t     t           t
c               p *(jac *jac)*p = r *r,
c
c         where p is a permutation matrix and jac is the final
c         calculated jacobian. column j of p is column ipvt(j)
c         (see below) of the identity matrix. the lower trapezoidal
c         part of fjac contains information generated during
c         the computation of r.
c
c       ldfjac is a positive integer input variable not less than M
c         which specifies the leading dimension of the array fjac.
c
c       ftol is a nonnegative input variable. termination
c         occurs when both the actual and predicted relative
c         reductions in the sum of squares are at most ftol.
c         therefore, ftol measures the relative error desired
c         in the sum of squares.
c
c       xtol is a nonnegative input variable. termination
c         occurs when the relative error between two consecutive
c         iterates is at most xtol. therefore, xtol measures the
c         relative error desired in the approximate solution.
c
c       gtol is a nonnegative input variable. termination
c         occurs when the cosine of the angle between fvec and
c         any column of the jacobian is at most gtol in absolute
c         value. therefore, gtol measures the orthogonality
c         desired between the function vector and the columns
c         of the jacobian.
c
c       maxfev is a positive integer input variable. termination
c         occurs when the number of calls to fcn with iflag = 1
c         has reached maxfev.
c
c       diag is an array of length N. if mode = 1 (see
c         below), diag is internally set. if mode = 2, diag
c         must contain positive entries that serve as
c         multiplicative scale factors for the variables.
c
c       mode is an integer input variable. if mode = 1, the
c         variables will be scaled internally. if mode = 2,
c         the scaling is specified by the input diag. other
c         values of mode are equivalent to mode = 1.
c
c       factor is a positive input variable used in determining the
c         initial step bound. this bound is set to the product of
c         factor and the euclidean norm of diag*x if nonzero, or else
c         to factor itself. in most cases factor should lie in the
c         interval (.1,100.).100. is a generally recommended value.
c
c       nprint is an integer input variable that enables controlled
c         printing of iterates if it is positive. in this case,
c         fcn is called with iflag = 0 at the beginning of the first
c         iteration and every nprint iterations thereafter and
c         immediately prior to return, with x, fvec, and fjac
c         available for printing. fvec and fjac should not be
c         altered. if nprint is not positive, no special calls
c         of fcn with iflag = 0 are made.
c
c       info is an integer output variable. if the user has
c         terminated execution, info is set to the (negative)
c         value of iflag. see description of fcn. otherwise,
c         info is set as follows.
c
c         info = 0  improper input parameters.
c
c         info = 1  both actual and predicted relative reductions
c                   in the sum of squares are at most ftol.
c
c         info = 2  relative error between two consecutive iterates
c                   is at most xtol.
c
c         info = 3  conditions for info = 1 and info = 2 both hold.
c
c         info = 4  the cosine of the angle between fvec and any
c                   column of the jacobian is at most gtol in
c                   absolute value.
c
c         info = 5  number of calls to fcn with iflag = 1 has
c                   reached maxfev.
c
c         info = 6  ftol is too small. no further reduction in
c                   the sum of squares is possible.
c
c         info = 7  xtol is too small. no further improvement in
c                   the approximate solution x is possible.
c
c         info = 8  gtol is too small. fvec is orthogonal to the
c                   columns of the jacobian to machine precision.
c
c       nfev is an integer output variable set to the number of
c         calls to fcn with iflag = 1.
c
c       njev is an integer output variable set to the number of
c         calls to fcn with iflag = 2.
c
c       ipvt is an integer output array of length N. ipvt
c         defines a permutation matrix p such that jac*p = q*r,
c         where jac is the final calculated jacobian, q is
c         orthogonal (not stored), and r is upper triangular
c         with diagonal elements of nonincreasing magnitude.
c         column j of p is column ipvt(j) of the identity matrix.
c
c       qtf is an output array of length N which contains
c         the first n elements of the vector (q transpose)*fvec.
     */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);
	wa3 = (double*) malloc(sizeof(double) *N);
	wa4 = (double*) malloc(sizeof(double) *M);

    one = 1.0;
    zero = 0.0;
    p1 = 1.0e-1; p5 = 5.0e-1; p25 = 2.5e-1; p75 = 7.5e-1; p0001 = 1.0e-4;
    epsmch = eps;

    info = 0;
    *nfev = 0;
    *njev = 0;

    if (N <= 0 || M < N || ldfjac < M || ftol < zero || xtol < zero || gtol < zero || maxfev <= 0 || factor <= zero) {
    	return info;
    }
    if (mode == 2) {
		for(j = 0; j < N;++j) {
			if (diag[j] <= 0.0) {
				return info;
			}
		}
    }

    //     evaluate the function at the starting point
    //     and calculate its norm.

    FUNCMULT_EVAL(funcmult,x,M,N,fvec);
    *nfev= 1;
    fnorm = enorm(fvec,M);

    //     initialize levenberg-marquardt parameter and iteration counter.
    par = zero;
    iter = 1;
    ratio = zero;

    //     beginning of the outer loop.

    while(1) {
    	//        calculate the jacobian matrix.
    	ratio = zero;
    	JACOBIAN_EVAL(jacobian,x,M,N,fjac);
    	*njev = *njev +1;

    	//        compute the qr factorization of the jacobian.

    	qrfac(fjac,M,N,ldfjac,1,ipvt,N,wa1,wa2,eps);

    	//        on the first iteration and if mode is 1, scale according
    	//        to the norms of the columns of the initial jacobian.

    	if (iter == 1) {//80
    		if (mode != 2) {//60
    			for(j = 0;j < N;++j) {
    				diag[j] = wa2[j];
    				if (wa2[j] == zero) {
    					diag[j] = one;
    				}
    			}
    		}//60

    		//        on the first iteration, calculate the norm of the scaled x
    		//        and initialize the step bound delta.

    		for(j = 0; j < N;++j) {
    			wa3[j] = diag[j]*x[j];
    		}
            xnorm = enorm(wa3,N);
            delta = factor*xnorm;

            if (delta == zero) {
            	delta = factor;
            }

    	}//80

        //        form (q transpose)*fvec and store the first n components in
        //        qtf.

    	for(i = 0; i < M;++i) {
    		wa4[i] = fvec[i];
    	}

    	for(j = 0; j < N;++j) {//130
    		if (fjac[j*N+j] != zero) {//120
    			sum = zero;
    			for(i = j; i < M;++i) {//100
    				sum = sum + fjac[i*N+j]*wa4[i];
    			}//100
    			temp = -sum/fjac[j*N+j];
    			for(i = j; i < M;++i) {//110
    				wa4[i] = wa4[i] + fjac[i*N+j]*temp;
    			}//110
    		}//120
            fjac[j*N+j] = wa1[j];
            qtf[j] = wa4[j];
    	}//130

    	//        compute the norm of the scaled gradient.
    	gnorm = zero;

    	if (fnorm != zero) {//170
    		for(j = 0; j < N;++j) {//160
    			l = ipvt[j];
    			if (wa2[l] != zero) {//150
    				sum = zero;
    				for(i = 0; i <= j;++i) { //140
    					sum = sum + fjac[i*N+j]*(qtf[i]/fnorm);
    				}//140
    				gnorm = pmax(gnorm,fabs(sum/wa2[l]));
    			}//150
    		}//160
    	}//170

    	//        test for convergence of the gradient norm.
    	if (gnorm <= gtol) {
    		info = 4;
    	}
    	if (info != 0) {
    		break;
    	}

    	//        rescale if necessary.
    	if (mode != 2) { //190
    		for(j = 0; j < N;++j) {
    			diag[j] = pmax(diag[j],wa2[j]);
    		}
    	}//190

    	//        beginning of the inner loop.

    	while(ratio < p0001) {
    		//           determine the levenberg-marquardt parameter.
    		lmpar(fjac,ldfjac,N,ipvt,diag,qtf,delta,&par,wa1,wa2);
    		//           store the direction p and x + p. calculate the norm of p.
    		for(j = 0; j < N;++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j]*wa1[j];
    		}
    		pnorm = enorm(wa3,N);
    		//           on the first iteration, adjust the initial step bound.
    		if (iter == 1) {
    			delta = pmin(delta,pnorm);
    		}
    		//           evaluate the function at x + p and calculate its norm.

    		FUNCMULT_EVAL(funcmult,wa2,M,N,wa4);
    		*nfev = *nfev + 1;
    		fnorm1 = enorm(wa4,M);

    		//           compute the scaled actual reduction.

            actred = -one;
            if (p1*fnorm1 < fnorm) {
            	actred = one - (fnorm1/fnorm)*(fnorm1/fnorm);
            }

            //           compute the scaled predicted reduction and
            //           the scaled directional derivative.

            for(j = 0; j < N;++j) {
                wa3[j] = zero;
                l = ipvt[j];
                temp = wa1[l];
                for(i = 0;i <= j;++i) {
                	wa3[i] = wa3[i] + fjac[i*N+j]*temp;
                }
            }

            temp1 = enorm(wa3,N);
            temp1 = temp1/fnorm;
            temp2 = (sqrt(par)*pnorm)/fnorm;
            prered = temp1*temp1 + temp2*temp2/p5;
            dirder = -(temp1*temp1 + temp2*temp2);
            //           compute the ratio of the actual to the predicted
            //           reduction.
            ratio = zero;
            if (prered != zero) {
            	ratio = actred/prered;
            }
            //           update the step bound.

            if (ratio <= p25) {//240
            	if (actred >= zero) {
            		temp = p5;
            	}
            	if (actred < zero) {
            		temp = p5*dirder/(dirder + p5*actred);
            	}
            	if (p1*fnorm1 >= fnorm || temp < p1) {
            		temp = p1;
            	}
                delta = temp*pmin(delta,pnorm/p1);
                par = par/temp;
            } else if (par == zero || ratio >= p75){//240 - 260
                delta = pnorm/p5;
                par = p5*par;
            }//260

            //           test for successful iteration.

            if (ratio >= p0001) {//290
            	//           successful iteration. update x, fvec, and their norms.
            	for(j = 0; j < N;++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j]*x[j];
            	}
            	for(i = 0; i < M;++i) {
            		fvec[i] = wa4[i];
            	}
                xnorm = enorm(wa2,N);
                fnorm = fnorm1;
                iter = iter + 1;
            }//290
            //           tests for convergence.
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one)) {
            	info = 1;
            }
            if (delta <= xtol*xnorm) {
            	info = 2;
            }
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one) && (info == 2)) {
            	info = 3;
            }
            if (info != 0) {
            	break;
            }

            //           tests for termination and stringent tolerances.
            if (*nfev >= maxfev) {
            	info = 5;
            }
            if ((fabs(actred) <= epsmch) && (prered <= epsmch) && (p5*ratio <= one)) {
            	info = 6;
            }
            if (delta <= epsmch*xnorm) {
            	info = 7;
            }
            if (gnorm <= epsmch) {
            	info = 8;
            }
            if (info != 0) {
            	break;
            }

    	}

        if (info != 0) {
        	break;
        }


    }


    free(wa1);
    free(wa2);
    free(wa3);
    free(wa4);

	return info;
}